

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O2

DecoderBuffer * __thiscall
defyx::DecoderBuffer::fetchNext
          (DecoderBuffer *this,SuperscalarInstructionType instrType,int cycle,int mulCount,
          Blake2Generator *gen)

{
  byte bVar1;
  DecoderBuffer *pDVar2;
  
  if ((uint)(instrType + ~IXOR_C9) < 2) {
    return (DecoderBuffer *)&decodeBuffer3310;
  }
  if (cycle < mulCount) {
    if (instrType == IMUL_RCP) {
      bVar1 = Blake2Generator::getByte(gen);
      if ((bVar1 & 1) == 0) {
        pDVar2 = (DecoderBuffer *)&decodeBuffer493;
      }
      else {
        pDVar2 = (DecoderBuffer *)&decodeBuffer484;
      }
      return pDVar2;
    }
    pDVar2 = fetchNextDefault(this,gen);
    return pDVar2;
  }
  return (DecoderBuffer *)&decodeBuffer4444;
}

Assistant:

const DecoderBuffer* fetchNext(SuperscalarInstructionType instrType, int cycle, int mulCount, Blake2Generator& gen) const {
			//If the current DefyX instruction is "IMULH", the next fetch configuration must be 3-3-10
			//because the full 128-bit multiplication instruction is 3 bytes long and decodes to 2 uOPs on Intel CPUs.
			//Intel CPUs can decode at most 4 uOPs per cycle, so this requires a 2-1-1 configuration for a total of 3 macro ops.
			if (instrType == SuperscalarInstructionType::IMULH_R || instrType == SuperscalarInstructionType::ISMULH_R)
				return &decodeBuffer3310;

			//To make sure that the multiplication port is saturated, a 4-4-4-4 configuration is generated if the number of multiplications
			//is lower than the number of cycles.
			if (mulCount < cycle + 1)
				return &decodeBuffer4444;

			//If the current DefyX instruction is "IMUL_RCP", the next buffer must begin with a 4-byte slot for multiplication.
			if(instrType == SuperscalarInstructionType::IMUL_RCP)
				return (gen.getByte() & 1) ? &decodeBuffer484 : &decodeBuffer493;

			//Default: select a random fetch configuration.
			return fetchNextDefault(gen);
		}